

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_digit.c
# Opt level: O0

void convert_digit_sequence_for_non_numerical_reading(NJDNode *start,NJDNode *end)

{
  int iVar1;
  char *pcVar2;
  long in_RSI;
  NJDNode *in_RDI;
  int size;
  NJDNode *node;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar3;
  NJDNode *local_18;
  
  iVar3 = 0;
  for (local_18 = in_RDI; local_18 != *(NJDNode **)(in_RSI + 0x70); local_18 = local_18->next) {
    iVar3 = iVar3 + 1;
  }
  if (1 < iVar3) {
    iVar3 = 0;
    for (local_18 = in_RDI; local_18 != *(NJDNode **)(in_RSI + 0x70); local_18 = local_18->next) {
      pcVar2 = NJDNode_get_string(local_18);
      iVar1 = strcmp(pcVar2,anon_var_dwarf_b2caf);
      if (iVar1 == 0) {
LAB_001843a9:
        NJDNode_set_pron((NJDNode *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
                         (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
        NJDNode_set_mora_size
                  ((NJDNode *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
      }
      else {
        pcVar2 = NJDNode_get_string(local_18);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_13ce);
        if (iVar1 == 0) goto LAB_001843a9;
        pcVar2 = NJDNode_get_string(local_18);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_b2cdc);
        if (iVar1 == 0) {
          NJDNode_set_pron((NJDNode *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
                           (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
          NJDNode_set_mora_size
                    ((NJDNode *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc)
          ;
        }
        else {
          pcVar2 = NJDNode_get_string(local_18);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_b2cf2);
          if (iVar1 == 0) {
            NJDNode_set_pron((NJDNode *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
                             (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
            NJDNode_set_mora_size
                      ((NJDNode *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffdc);
          }
        }
      }
      NJDNode_set_chain_rule
                ((NJDNode *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
                 (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      if (iVar3 % 2 == 0) {
        NJDNode_set_chain_flag(local_18,0);
      }
      else {
        NJDNode_set_chain_flag(local_18,1);
        NJDNode_set_acc((NJDNode *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffdc);
      }
      iVar3 = iVar3 + 1;
    }
  }
  return;
}

Assistant:

static void convert_digit_sequence_for_non_numerical_reading(NJDNode * start, NJDNode * end)
{
   NJDNode *node;
   int size = 0;

   for (node = start; node != end->next; node = node->next)
      size++;
   if (size <= 1)
      return;

   for (node = start, size = 0; node != end->next; node = node->next) {
      if (strcmp(NJDNode_get_string(node), NJD_SET_DIGIT_ZERO1) == 0
          || strcmp(NJDNode_get_string(node), NJD_SET_DIGIT_ZERO2) == 0) {
         NJDNode_set_pron(node, NJD_SET_DIGIT_ZERO_AFTER_DP);
         NJDNode_set_mora_size(node, 2);
      } else if (strcmp(NJDNode_get_string(node), NJD_SET_DIGIT_TWO) == 0) {
         NJDNode_set_pron(node, NJD_SET_DIGIT_TWO_AFTER_DP);
         NJDNode_set_mora_size(node, 2);
      } else if (strcmp(NJDNode_get_string(node), NJD_SET_DIGIT_FIVE) == 0) {
         NJDNode_set_pron(node, NJD_SET_DIGIT_FIVE_AFTER_DP);
         NJDNode_set_mora_size(node, 2);
      }
      NJDNode_set_chain_rule(node, NULL);
      if (size % 2 == 0) {
         NJDNode_set_chain_flag(node, 0);
      } else {
         NJDNode_set_chain_flag(node, 1);
         NJDNode_set_acc(node->prev, 3);
      }
      size++;
   }
}